

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::detail::StringMakerBase<true>::convert<char[117]>
                   (String *__return_storage_ptr__,char (*in) [117])

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = tlssPush();
  sVar2 = strlen(*in);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,*in,sVar2);
  tlssPop();
  return __return_storage_ptr__;
}

Assistant:

static String convert(const DOCTEST_REF_WRAP(T) in) {
            /* When parameter "in" is a null terminated const char* it works.
             * When parameter "in" is a T arr[N] without '\0' we can fill the
             * stringstream with N objects (T=char).If in is char pointer *
             * without '\0' , it would cause segfault
             * stepping over unaccessible memory.
             */

            std::ostream* stream = tlssPush();
            filloss(stream, in);
            return tlssPop();
        }